

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

StringView __thiscall anon_unknown.dwarf_24939c::Db::parseBareSourceName(Db *this)

{
  bool bVar1;
  size_t sVar2;
  size_t local_28;
  size_t Int;
  Db *this_local;
  StringView R;
  
  local_28 = 0;
  Int = (size_t)this;
  bVar1 = parsePositiveInteger(this,&local_28);
  if ((!bVar1) && (sVar2 = numLeft(this), local_28 <= sVar2)) {
    StringView::StringView((StringView *)&this_local,this->First,this->First + local_28);
    this->First = this->First + local_28;
    return _this_local;
  }
  StringView::StringView((StringView *)&this_local);
  return _this_local;
}

Assistant:

StringView Db::parseBareSourceName() {
  size_t Int = 0;
  if (parsePositiveInteger(&Int) || numLeft() < Int)
    return StringView();
  StringView R(First, First + Int);
  First += Int;
  return R;
}